

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin_text(nk_context *ctx,char *selected,int len,nk_vec2 size)

{
  float fVar1;
  nk_window *win_00;
  nk_rect b;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect header_00;
  int iVar2;
  float fVar3;
  nk_context *local_c0;
  nk_symbol_type local_b0;
  undefined1 local_ac [4];
  nk_symbol_type sym;
  nk_rect content;
  nk_rect button;
  nk_rect label;
  nk_text text;
  nk_style_item *background;
  nk_rect header;
  int is_clicked;
  nk_widget_layout_states s;
  nk_style *style;
  nk_window *win;
  nk_input *in;
  int len_local;
  char *selected_local;
  nk_context *ctx_local;
  nk_vec2 size_local;
  
  header.w = 0.0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5f32,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  if (selected == (char *)0x0) {
    __assert_fail("selected",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5f33,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5f34,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5f35,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  if ((((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
      (ctx->current->layout == (nk_panel *)0x0)) || (selected == (char *)0x0)) {
    size_local.x = 0.0;
  }
  else {
    win_00 = ctx->current;
    header.h = (float)nk_widget((nk_rect *)&background,ctx);
    if (header.h == 0.0) {
      size_local.x = 0.0;
    }
    else {
      if (((win_00->layout->flags & 0x1000) != 0) || (local_c0 = ctx, header.h == 2.8026e-45)) {
        local_c0 = (nk_context *)0x0;
      }
      r.y = background._4_4_;
      r.x = background._0_4_;
      r.w = header.x;
      r.h = header.y;
      iVar2 = nk_button_behavior(&ctx->last_widget_state,r,&local_c0->input,NK_BUTTON_DEFAULT);
      if (iVar2 != 0) {
        header.w = 1.4013e-45;
      }
      if ((ctx->last_widget_state & 0x20) == 0) {
        if ((ctx->last_widget_state & 0x10) == 0) {
          text._8_8_ = &(ctx->style).combo;
        }
        else {
          text._8_8_ = &(ctx->style).combo.hover;
        }
      }
      else {
        text._8_8_ = &(ctx->style).combo.active;
      }
      if (*(int *)text._8_8_ == 1) {
        label.w = (float)nk_rgba(0,0,0,0);
        r_00.y = background._4_4_;
        r_00.x = background._0_4_;
        r_00.w = header.x;
        r_00.h = header.y;
        nk_draw_image(&win_00->buffer,r_00,(nk_image *)(text._8_8_ + 8),(nk_color)0xffffffff);
      }
      else {
        rect.y = background._4_4_;
        rect.x = background._0_4_;
        rect.w = header.x;
        rect.h = header.y;
        nk_fill_rect(&win_00->buffer,rect,(ctx->style).combo.rounding,*(nk_color *)(text._8_8_ + 8))
        ;
        rect_00.y = background._4_4_;
        rect_00.x = background._0_4_;
        rect_00.w = header.x;
        rect_00.h = header.y;
        nk_stroke_rect(&win_00->buffer,rect_00,(ctx->style).combo.rounding,(ctx->style).combo.border
                       ,(ctx->style).combo.border_color);
      }
      if ((ctx->last_widget_state & 0x10) == 0) {
        if (header.w == 0.0) {
          local_b0 = (ctx->style).combo.sym_normal;
        }
        else {
          local_b0 = (ctx->style).combo.sym_active;
        }
      }
      else {
        local_b0 = (ctx->style).combo.sym_hover;
      }
      fVar1 = (ctx->style).combo.button_padding.y;
      fVar3 = header.y - (fVar1 + fVar1);
      content.w = ((background._0_4_ + header.x) - header.y) - (ctx->style).combo.button_padding.x;
      content.h = background._4_4_ + (ctx->style).combo.button_padding.y;
      local_ac = (undefined1  [4])(content.w + (ctx->style).combo.button.padding.x);
      sym = (nk_symbol_type)(content.h + (ctx->style).combo.button.padding.y);
      fVar1 = (ctx->style).combo.button.padding.x;
      content.x = fVar3 - (fVar1 + fVar1);
      fVar1 = (ctx->style).combo.button.padding.y;
      content.y = fVar3 - (fVar1 + fVar1);
      register0x00001200 = nk_vec2(0.0,0.0);
      fVar3 = background._0_4_ + (ctx->style).combo.content_padding.x;
      label.x = (content.w - ((ctx->style).combo.content_padding.x + (ctx->style).combo.spacing.x))
                - fVar3;
      fVar1 = (ctx->style).combo.content_padding.y;
      label.y = header.y - (fVar1 + fVar1);
      b.y = background._4_4_ + (ctx->style).combo.content_padding.y;
      b.x = fVar3;
      b.w = label.x;
      b.h = label.y;
      nk_widget_text(&win_00->buffer,b,selected,len,(nk_text *)&label.h,0x11,(ctx->style).font);
      nk_draw_button_symbol
                (&win_00->buffer,(nk_rect *)&content.w,(nk_rect *)local_ac,ctx->last_widget_state,
                 &(ctx->style).combo.button,local_b0,(ctx->style).font);
      header_00.y = background._4_4_;
      header_00.x = background._0_4_;
      header_00.w = header.x;
      header_00.h = header.y;
      size_local.x = (float)nk_combo_begin(ctx,win_00,size,(int)header.w,header_00);
    }
  }
  return (int)size_local.x;
}

Assistant:

NK_API int
nk_combo_begin_text(struct nk_context *ctx, const char *selected, int len,
    struct nk_vec2 size)
{
    const struct nk_input *in;
    struct nk_window *win;
    struct nk_style *style;

    enum nk_widget_layout_states s;
    int is_clicked = nk_false;
    struct nk_rect header;
    const struct nk_style_item *background;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(selected);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !selected)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        /* print currently selected text item */
        struct nk_rect label;
        struct nk_rect button;
        struct nk_rect content;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw selected label */
        text.padding = nk_vec2(0,0);
        label.x = header.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = button.x - (style->combo.content_padding.x + style->combo.spacing.x) - label.x;;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text,
            NK_TEXT_LEFT, ctx->style.font);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}